

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O3

bool __thiscall picojson::default_parse_context::set_null(default_parse_context *this)

{
  value local_18;
  
  local_18.type_ = 0;
  value::operator=(this->out_,&local_18);
  if (local_18.type_ == 5) {
    if (local_18.u_.string_ != (string *)0x0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                   *)local_18.u_.string_);
      goto LAB_0016ab6f;
    }
  }
  else if (local_18.type_ == 4) {
    if (local_18.u_.string_ != (string *)0x0) {
      std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                ((vector<picojson::value,_std::allocator<picojson::value>_> *)local_18.u_.string_);
      goto LAB_0016ab6f;
    }
  }
  else {
    if (local_18.type_ != 3) {
      return true;
    }
    if (local_18.u_.string_ != (string *)0x0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*(undefined1 **)
              &(local_18.u_.array_)->
               super__Vector_base<picojson::value,_std::allocator<picojson::value>_> !=
          &(local_18.u_.string_)->field_2) {
        operator_delete(*(undefined1 **)
                         &(local_18.u_.array_)->
                          super__Vector_base<picojson::value,_std::allocator<picojson::value>_>);
      }
      goto LAB_0016ab6f;
    }
  }
  local_18.u_.number_ = 0.0;
LAB_0016ab6f:
  operator_delete(local_18.u_.string_);
  return true;
}

Assistant:

bool set_null() {
      *out_ = value();
      return true;
    }